

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QCborValue * QCborValue::fromCbor(QCborValue *__return_storage_ptr__,QCborStreamReader *reader)

{
  QCborContainerPrivate *pQVar1;
  Type TVar2;
  QCborError QVar3;
  QCborContainerPrivate *pQVar4;
  byte bVar5;
  long in_FS_OFFSET;
  Element EVar6;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
  bVar5 = reader->type_;
  QVar3 = QCborStreamReader::lastError((QCborStreamReader *)reader);
  bVar5 = -(QVar3.c != NoError) | bVar5;
  if (bVar5 < 0xc0) {
    if (bVar5 < 0x60) {
      if ((bVar5 == 0) || (bVar5 == 0x20)) goto LAB_002e7fe8;
      if (bVar5 != 0x40) goto LAB_002e808e;
    }
    else if (bVar5 != 0x60) {
      if ((bVar5 == 0x80) || (bVar5 == 0xa0)) {
        __return_storage_ptr__->n = -1;
        __return_storage_ptr__->t = (reader->type_ != 0x80 | 4) << 5;
        pQVar4 = createContainerFromCbor(reader,0x400);
        __return_storage_ptr__->container = pQVar4;
      }
      goto LAB_002e808e;
    }
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->t = (uint)(reader->type_ == '`') << 5 | ByteArray;
    pQVar4 = (QCborContainerPrivate *)operator_new(0x40);
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    pQVar4->usedData = 0;
    (pQVar4->data).d.d = (Data *)0x0;
    (pQVar4->data).d.ptr = (char *)0x0;
    (pQVar4->data).d.size = 0;
    (pQVar4->elements).d.d = (Data *)0x0;
    (pQVar4->elements).d.ptr = (Element *)0x0;
    (pQVar4->elements).d.size = 0;
    __return_storage_ptr__->container = pQVar4;
    LOCK();
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QCborContainerPrivate::decodeStringFromCbor(__return_storage_ptr__->container,reader);
  }
  else {
    if (bVar5 < 0xf9) {
      if (bVar5 == 0xc0) {
        taggedValueFromCbor(&local_38,reader,0x400);
        TVar2 = local_38.t;
        pQVar1 = local_38.container;
        local_38.container = (QCborContainerPrivate *)0x0;
        local_38.t = Undefined;
        pQVar4 = __return_storage_ptr__->container;
        __return_storage_ptr__->n = local_38.n;
        __return_storage_ptr__->container = pQVar1;
        __return_storage_ptr__->t = TVar2;
        if (pQVar4 != (QCborContainerPrivate *)0x0) {
          QCborContainerPrivate::deref(pQVar4);
        }
        goto LAB_002e808e;
      }
      if (bVar5 != 0xe0) goto LAB_002e808e;
    }
    else if (2 < bVar5 - 0xf9) {
      if (bVar5 == 0xff) {
        __return_storage_ptr__->t = Invalid;
      }
      goto LAB_002e808e;
    }
LAB_002e7fe8:
    EVar6 = decodeBasicValueFromCbor(reader);
    __return_storage_ptr__->n = (qint64)EVar6.field_0;
    __return_storage_ptr__->t = EVar6.type;
  }
LAB_002e808e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QCborValue QCborValue::fromCbor(QCborStreamReader &reader)
{
    QCborValue result;
    auto t = reader.type();
    if (reader.lastError() != QCborError::NoError)
        t = QCborStreamReader::Invalid;

    switch (t) {
    // basic types, no container needed:
    case QCborStreamReader::UnsignedInteger:
    case QCborStreamReader::NegativeInteger:
    case QCborStreamReader::SimpleType:
    case QCborStreamReader::Float16:
    case QCborStreamReader::Float:
    case QCborStreamReader::Double: {
        Element e = decodeBasicValueFromCbor(reader);
        result.n = e.value;
        result.t = e.type;
        break;
    }

    case QCborStreamReader::Invalid:
        result.t = QCborValue::Invalid;
        break;              // probably a decode error

    // strings
    case QCborStreamReader::ByteArray:
    case QCborStreamReader::String:
        result.n = 0;
        result.t = reader.isString() ? String : ByteArray;
        result.container = new QCborContainerPrivate;
        result.container->ref.ref();
        result.container->decodeStringFromCbor(reader);
        break;

    // containers
    case QCborStreamReader::Array:
    case QCborStreamReader::Map:
        result.n = -1;
        result.t = reader.isArray() ? Array : Map;
        result.container = createContainerFromCbor(reader, MaximumRecursionDepth);
        break;

    // tag
    case QCborStreamReader::Tag:
        result = taggedValueFromCbor(reader, MaximumRecursionDepth);
        break;
    }

    return result;
}